

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

sysbvm_object_tuple_t * sysbvm_heap_allocateByteTuple(sysbvm_heap_t *heap,size_t byteSize)

{
  sysbvm_object_tuple_t *result;
  size_t allocationSize;
  size_t byteSize_local;
  sysbvm_heap_t *heap_local;
  
  heap_local = (sysbvm_heap_t *)sysbvm_heap_allocateTupleWithRawSize(heap,byteSize + 0x18,0x10);
  if (heap_local == (sysbvm_heap_t *)0x0) {
    heap_local = (sysbvm_heap_t *)0x0;
  }
  else {
    *(uint32_t *)&heap_local->lastMallocObject = heap->gcWhiteColor | 0x200;
    *(uint32_t *)((long)&heap_local->lastMallocObject + 4) = (uint32_t)byteSize;
  }
  return (sysbvm_object_tuple_t *)heap_local;
}

Assistant:

SYSBVM_API sysbvm_object_tuple_t *sysbvm_heap_allocateByteTuple(sysbvm_heap_t *heap, size_t byteSize)
{
    size_t allocationSize = sizeof(sysbvm_object_tuple_t) + byteSize;
    sysbvm_object_tuple_t *result = sysbvm_heap_allocateTupleWithRawSize(heap, allocationSize, 16);
    if(!result) return 0;

    result->header.identityHashAndFlags = (SYSBVM_TUPLE_OBJECT_KIND_BYTES << SYSBVM_TUPLE_OBJECT_KIND_SHIFT) | (heap->gcWhiteColor << SYSBVM_TUPLE_GC_COLOR_SHIFT);
    result->header.objectSize = byteSize;
    return result;
}